

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetWindowConditionAllowFlags(ImGuiWindow *window,ImGuiCond flags,bool enabled)

{
  uint local_24;
  uint local_20;
  uint local_1c;
  bool enabled_local;
  ImGuiCond flags_local;
  ImGuiWindow *window_local;
  
  if (enabled) {
    local_1c = window->SetWindowPosAllowFlags | flags;
  }
  else {
    local_1c = window->SetWindowPosAllowFlags & (flags ^ 0xffffffffU);
  }
  window->SetWindowPosAllowFlags = local_1c;
  if (enabled) {
    local_20 = window->SetWindowSizeAllowFlags | flags;
  }
  else {
    local_20 = window->SetWindowSizeAllowFlags & (flags ^ 0xffffffffU);
  }
  window->SetWindowSizeAllowFlags = local_20;
  if (enabled) {
    local_24 = window->SetWindowCollapsedAllowFlags | flags;
  }
  else {
    local_24 = window->SetWindowCollapsedAllowFlags & (flags ^ 0xffffffffU);
  }
  window->SetWindowCollapsedAllowFlags = local_24;
  return;
}

Assistant:

static void SetWindowConditionAllowFlags(ImGuiWindow* window, ImGuiCond flags, bool enabled)
{
    window->SetWindowPosAllowFlags       = enabled ? (window->SetWindowPosAllowFlags       | flags) : (window->SetWindowPosAllowFlags       & ~flags);
    window->SetWindowSizeAllowFlags      = enabled ? (window->SetWindowSizeAllowFlags      | flags) : (window->SetWindowSizeAllowFlags      & ~flags);
    window->SetWindowCollapsedAllowFlags = enabled ? (window->SetWindowCollapsedAllowFlags | flags) : (window->SetWindowCollapsedAllowFlags & ~flags);
}